

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetInitialValue
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int var_index,double value)

{
  pointer pdVar1;
  
  pdVar1 = (this->initial_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->initial_values_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <=
      (ulong)(uint)var_index) {
    std::vector<double,_std::allocator<double>_>::reserve
              (&this->initial_values_,
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->initial_values_,
               (long)(int)((ulong)((long)(this->vars_).
                                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->vars_).
                                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    std::vector<int,_std::allocator<int>_>::reserve
              (&this->iv_set_,
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->iv_set_,
               (long)(int)((ulong)((long)(this->vars_).
                                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->vars_).
                                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    pdVar1 = (this->initial_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pdVar1[var_index] = value;
  (this->iv_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[var_index] = 1;
  return;
}

Assistant:

void SetInitialValue(int var_index, double value) {
    if (initial_values_.size() <= static_cast<unsigned>(var_index)) {
      initial_values_.reserve(vars_.capacity());
      initial_values_.resize(num_vars());
      iv_set_.reserve(vars_.capacity());
      iv_set_.resize(num_vars());
    }
    initial_values_[var_index] = value;
    iv_set_[var_index] = 1;
  }